

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint generateFixedDistanceTree(HuffmanTree *tree)

{
  uint *puVar1;
  uint extraout_EAX;
  uint *bitlen;
  long lVar2;
  
  bitlen = (uint *)malloc(0x80);
  if (bitlen != (uint *)0x0) {
    lVar2 = 0;
    do {
      puVar1 = bitlen + lVar2;
      puVar1[0] = 5;
      puVar1[1] = 5;
      puVar1[2] = 5;
      puVar1[3] = 5;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x20);
    HuffmanTree_makeFromLengths(tree,bitlen,0x20,0xf);
    free(bitlen);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

static unsigned generateFixedDistanceTree(HuffmanTree* tree)
{
	unsigned i, error = 0;
	unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
	if (!bitlen) return 83; /*alloc fail*/

	/*there are 32 distance codes, but 30-31 are unused*/
	for (i = 0; i != NUM_DISTANCE_SYMBOLS; ++i) bitlen[i] = 5;
	error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DISTANCE_SYMBOLS, 15);

	lodepng_free(bitlen);
	return error;
}